

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O2

ParameterError file2memory(char **bufp,size_t *size,FILE *file)

{
  CURLcode CVar1;
  ParameterError PVar2;
  size_t len;
  size_t sVar3;
  char *pcVar4;
  dynbuf dyn;
  char buffer [4096];
  
  if (file == (FILE *)0x0) {
    *size = 0;
    *bufp = (char *)0x0;
LAB_00119470:
    PVar2 = PARAM_OK;
  }
  else {
    curlx_dyn_init(&dyn,0x40000000);
    do {
      len = fread(buffer,1,0x1000,(FILE *)file);
      if (len == 0) {
        sVar3 = curlx_dyn_len(&dyn);
        *size = sVar3;
        pcVar4 = curlx_dyn_ptr(&dyn);
        *bufp = pcVar4;
        goto LAB_00119470;
      }
      CVar1 = curlx_dyn_addn(&dyn,buffer,len);
    } while (CVar1 == CURLE_OK);
    PVar2 = PARAM_NO_MEM;
  }
  return PVar2;
}

Assistant:

ParameterError file2memory(char **bufp, size_t *size, FILE *file)
{
  if(file) {
    size_t nread;
    struct curlx_dynbuf dyn;
    curlx_dyn_init(&dyn, MAX_FILE2MEMORY);
    do {
      char buffer[4096];
      nread = fread(buffer, 1, sizeof(buffer), file);
      if(nread)
        if(curlx_dyn_addn(&dyn, buffer, nread))
          return PARAM_NO_MEM;
    } while(nread);
    *size = curlx_dyn_len(&dyn);
    *bufp = curlx_dyn_ptr(&dyn);
  }
  else {
    *size = 0;
    *bufp = NULL;
  }
  return PARAM_OK;
}